

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

QTextFrame * __thiscall QTextDocumentPrivate::rootFrame(QTextDocumentPrivate *this)

{
  QTextFrame *pQVar1;
  long in_FS_OFFSET;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->rtFrame;
  if (pQVar1 == (QTextFrame *)0x0) {
    local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextFrameFormat::QTextFrameFormat((QTextFrameFormat *)local_28);
    QTextFrameFormat::setMargin((QTextFrameFormat *)local_28,this->documentMargin);
    createObject(this,(QTextFormat *)local_28,-1);
    pQVar1 = (QTextFrame *)QMetaObject::cast((QObject *)&QTextFrame::staticMetaObject);
    this->rtFrame = pQVar1;
    QTextFormat::~QTextFormat((QTextFormat *)local_28);
    pQVar1 = this->rtFrame;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QTextFrame *QTextDocumentPrivate::rootFrame() const
{
    if (!rtFrame) {
        QTextFrameFormat defaultRootFrameFormat;
        defaultRootFrameFormat.setMargin(documentMargin);
        rtFrame = qobject_cast<QTextFrame *>(const_cast<QTextDocumentPrivate *>(this)->createObject(defaultRootFrameFormat));
    }
    return rtFrame;
}